

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

double sampleOctaveAmp(OctaveNoise *noise,double x,double y,double z,double yamp,double ymin,
                      int ydefault)

{
  PerlinNoise *pPVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double d2;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)noise->octcnt;
  if (noise->octcnt < 1) {
    uVar2 = uVar3;
  }
  dVar4 = 0.0;
  for (; uVar2 * 0x140 - uVar3 != 0; uVar3 = uVar3 + 0x140) {
    pPVar1 = noise->octaves;
    dVar5 = *(double *)((long)&pPVar1->lacunarity + uVar3);
    if (ydefault == 0) {
      d2 = dVar5 * y;
    }
    else {
      d2 = -*(double *)((long)&pPVar1->b + uVar3);
    }
    dVar5 = samplePerlin((PerlinNoise *)(pPVar1->d + uVar3),dVar5 * x,d2,dVar5 * z,dVar5 * yamp,
                         dVar5 * ymin);
    dVar4 = dVar4 + dVar5 * *(double *)((long)&pPVar1->amplitude + uVar3);
  }
  return dVar4;
}

Assistant:

double sampleOctaveAmp(const OctaveNoise *noise, double x, double y, double z,
        double yamp, double ymin, int ydefault)
{
    double v = 0;
    int i;
    for (i = 0; i < noise->octcnt; i++)
    {
        PerlinNoise *p = noise->octaves + i;
        double lf = p->lacunarity;
        double ax = maintainPrecision(x * lf);
        double ay = ydefault ? -p->b : maintainPrecision(y * lf);
        double az = maintainPrecision(z * lf);
        double pv = samplePerlin(p, ax, ay, az, yamp * lf, ymin * lf);
        v += p->amplitude * pv;
    }
    return v;
}